

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

pair<google::dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>,_bool>
* __thiscall
google::
dense_hashtable<std::pair<int_const,A>,int,std::hash<int>,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SelectKey,google::dense_hash_map<int,A,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,A>>>
::insert_noresize<int,std::piecewise_construct_t_const&,std::tuple<int&&>,std::tuple<int&&>>
          (dense_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
           *this,int *key,piecewise_construct_t *args,tuple<int_&&> *args_1,tuple<int_&&> *args_2)

{
  pointer in_RSI;
  pair<google::dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>,_bool>
  *in_RDI;
  pair<unsigned_long,_unsigned_long> pVar1;
  pair<unsigned_long,_unsigned_long> pos;
  pair<google::dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>,_bool>
  *it_end;
  undefined7 in_stack_ffffffffffffff88;
  bool in_stack_ffffffffffffff8f;
  dense_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  *in_stack_ffffffffffffff90;
  pointer in_stack_ffffffffffffff98;
  dense_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  *in_stack_ffffffffffffffa0;
  bool local_51;
  dense_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
  *in_stack_ffffffffffffffb0;
  pointer in_stack_ffffffffffffffb8;
  pointer in_stack_ffffffffffffffc0;
  
  it_end = in_RDI;
  pVar1 = dense_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
          ::find_position<int>(in_stack_ffffffffffffffa0,&in_stack_ffffffffffffff98->first);
  if (pVar1.first == 0xffffffffffffffff) {
    insert_at<std::piecewise_construct_t_const&,std::tuple<int&&>,std::tuple<int&&>>
              ((dense_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                *)pVar1.second,0xffffffffffffffff,(piecewise_construct_t *)in_stack_ffffffffffffffc0
               ,(tuple<int_&&> *)in_stack_ffffffffffffffb8,
               (tuple<int_&&> *)in_stack_ffffffffffffffb0);
    std::
    pair<google::dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>,_bool>
    ::
    pair<google::dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>,_bool,_true>
              (in_RDI,(dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                       *)&stack0xffffffffffffff90,(bool *)&stack0xffffffffffffff8f);
  }
  else {
    dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
    ::dense_hashtable_iterator
              ((dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                *)in_stack_ffffffffffffff90,
               (dense_hashtable<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),in_RSI,
               (pointer)it_end,SUB81((ulong)in_RDI >> 0x38,0));
    local_51 = false;
    std::
    pair<google::dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>,_bool>
    ::
    pair<google::dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>,_bool,_true>
              (in_RDI,(dense_hashtable_iterator<std::pair<const_int,_A>,_int,_std::hash<int>,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SelectKey,_google::dense_hash_map<int,_A,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_A>_>_>
                       *)&stack0xffffffffffffffb0,&local_51);
  }
  return it_end;
}

Assistant:

std::pair<iterator, bool> insert_noresize(K&& key, Args&&... args) {
    // First, double-check we're not inserting delkey or emptyval
    assert(settings.use_empty() && "Inserting without empty key");
    assert(!equals(std::forward<K>(key), key_info.empty_key) && "Inserting the empty key");
    assert((!settings.use_deleted() || !equals(key, key_info.delkey)) && "Inserting the deleted key");

    const std::pair<size_type, size_type> pos = find_position(key);
    if (pos.first != ILLEGAL_BUCKET) {  // object was already there
      return std::pair<iterator, bool>(
          iterator(this, table + pos.first, table + num_buckets, false),
          false);  // false: we didn't insert
    } else {       // pos.second says where to put it
      return std::pair<iterator, bool>(insert_at(pos.second, std::forward<Args>(args)...), true);
    }
  }